

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsVertexArrayTests.cpp
# Opt level: O2

void deqp::gls::RandomArrayGenerator::setData
               (char *data,InputType type,deRandom *rnd,GLValue min,GLValue max)

{
  uint uVar1;
  ushort uVar2;
  Ubyte UVar3;
  Half HVar4;
  Uint UVar5;
  uint uVar6;
  int iVar7;
  Float FVar8;
  
  uVar6 = min.field_1._1_4_;
  iVar7 = min.field_1._2_4_;
  uVar2 = min.field_1._0_2_;
  uVar1 = min.field_1._0_4_;
  HVar4.m_value = max.field_1._0_2_;
  switch(type) {
  case INPUTTYPE_FLOAT:
    FVar8 = getRandom<deqp::gls::GLValue::WrappedFloatType<float>>
                      (rnd,(Float)((uVar6 & 0xff) << 8 | uVar1 & 0xff | iVar7 << 0x10),
                       max.field_1.fl.m_value);
    *(float *)data = FVar8.m_value;
    break;
  case INPUTTYPE_FIXED:
    UVar5.m_value =
         (uint)getRandom<deqp::gls::GLValue::Fixed>
                         (rnd,(uVar6 & 0xff) << 8 | uVar1 & 0xff | iVar7 << 0x10,
                          max.field_1.fi.m_value);
    goto LAB_014ec676;
  case INPUTTYPE_DOUBLE:
    FVar8 = getRandom<deqp::gls::GLValue::WrappedFloatType<float>>
                      (rnd,(Float)((uVar6 & 0xff) << 8 | uVar1 & 0xff | iVar7 << 0x10),
                       max.field_1.fl.m_value);
    *(double *)data = (double)FVar8.m_value;
    break;
  case INPUTTYPE_BYTE:
    UVar3.m_value =
         (uchar)getRandom<deqp::gls::GLValue::WrappedType<signed_char>>
                          (rnd,min.field_1._0_1_,max.field_1._0_1_);
    goto LAB_014ec638;
  case INPUTTYPE_SHORT:
    HVar4.m_value =
         (deFloat16)
         getRandom<deqp::gls::GLValue::WrappedType<short>>
                   (rnd,(Short)(uVar2 & 0xff | (ushort)(uVar6 << 8)),HVar4.m_value);
    goto LAB_014ec652;
  case INPUTTYPE_UNSIGNED_BYTE:
    UVar3 = getRandom<deqp::gls::GLValue::WrappedType<unsigned_char>>
                      (rnd,min.field_1._0_1_,max.field_1._0_1_);
LAB_014ec638:
    *data = UVar3.m_value;
    break;
  case INPUTTYPE_UNSIGNED_SHORT:
    HVar4.m_value =
         (deFloat16)
         getRandom<deqp::gls::GLValue::WrappedType<unsigned_short>>
                   (rnd,(Ushort)(uVar2 & 0xff | (ushort)(uVar6 << 8)),HVar4.m_value);
    goto LAB_014ec652;
  case INPUTTYPE_INT:
    UVar5.m_value =
         (uint)getRandom<deqp::gls::GLValue::WrappedType<int>>
                         (rnd,(uVar6 & 0xff) << 8 | uVar1 & 0xff | iVar7 << 0x10,
                          max.field_1.i.m_value);
    goto LAB_014ec676;
  case INPUTTYPE_UNSIGNED_INT:
    UVar5 = getRandom<deqp::gls::GLValue::WrappedType<unsigned_int>>
                      (rnd,(uVar6 & 0xff) << 8 | uVar1 & 0xff | iVar7 << 0x10,max.field_1.ui.m_value
                      );
LAB_014ec676:
    *(uint *)data = UVar5.m_value;
    break;
  case INPUTTYPE_HALF:
    HVar4 = getRandom<deqp::gls::GLValue::Half>
                      (rnd,(Half)(uVar2 & 0xff | (ushort)(uVar6 << 8)),HVar4);
LAB_014ec652:
    *(deFloat16 *)data = HVar4.m_value;
  }
  return;
}

Assistant:

void RandomArrayGenerator::setData (char* data, Array::InputType type, deRandom& rnd, GLValue min, GLValue max)
{
	switch (type)
	{
		case Array::INPUTTYPE_FLOAT:
		{
			alignmentSafeAssignment<float>(data, getRandom<GLValue::Float>(rnd, min.fl, max.fl));
			break;
		}

		case Array::INPUTTYPE_DOUBLE:
		{
			alignmentSafeAssignment<double>(data, getRandom<GLValue::Float>(rnd, min.fl, max.fl));
			break;
		}

		case Array::INPUTTYPE_SHORT:
		{
			alignmentSafeAssignment<deInt16>(data, getRandom<GLValue::Short>(rnd, min.s, max.s));
			break;
		}

		case Array::INPUTTYPE_UNSIGNED_SHORT:
		{
			alignmentSafeAssignment<deUint16>(data, getRandom<GLValue::Ushort>(rnd, min.us, max.us));
			break;
		}

		case Array::INPUTTYPE_BYTE:
		{
			alignmentSafeAssignment<deInt8>(data, getRandom<GLValue::Byte>(rnd, min.b, max.b));
			break;
		}

		case Array::INPUTTYPE_UNSIGNED_BYTE:
		{
			alignmentSafeAssignment<deUint8>(data, getRandom<GLValue::Ubyte>(rnd, min.ub, max.ub));
			break;
		}

		case Array::INPUTTYPE_FIXED:
		{
			alignmentSafeAssignment<deInt32>(data, getRandom<GLValue::Fixed>(rnd, min.fi, max.fi));
			break;
		}

		case Array::INPUTTYPE_INT:
		{
			alignmentSafeAssignment<deInt32>(data, getRandom<GLValue::Int>(rnd, min.i, max.i));
			break;
		}

		case Array::INPUTTYPE_UNSIGNED_INT:
		{
			alignmentSafeAssignment<deUint32>(data, getRandom<GLValue::Uint>(rnd, min.ui, max.ui));
			break;
		}

		case Array::INPUTTYPE_HALF:
		{
			alignmentSafeAssignment<deFloat16>(data, getRandom<GLValue::Half>(rnd, min.h, max.h).getValue());
			break;
		}

		default:
			DE_ASSERT(false);
			break;
	}
}